

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O1

void __thiscall QIODevice::setOpenMode(QIODevice *this,OpenMode openMode)

{
  QIODevicePrivate *this_00;
  int iVar1;
  
  this_00 = (QIODevicePrivate *)(this->super_QObject).d_ptr.d;
  (this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
       (Int)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
            super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
  this_00->accessMode = Unset;
  iVar1 = 0;
  if (((ulong)(this->super_QObject).d_ptr.d[4].bindingStorage.d & 1) != 0) {
    iVar1 = 1;
    if (1 < this_00->readChannelCount) {
      iVar1 = this_00->readChannelCount;
    }
  }
  QIODevicePrivate::setReadChannelCount(this_00,iVar1);
  iVar1 = 0;
  if (((ulong)(this->super_QObject).d_ptr.d[4].bindingStorage.d & 2) != 0) {
    iVar1 = 1;
    if (1 < this_00->writeChannelCount) {
      iVar1 = this_00->writeChannelCount;
    }
  }
  QIODevicePrivate::setWriteChannelCount(this_00,iVar1);
  return;
}

Assistant:

void QIODevice::setOpenMode(QIODeviceBase::OpenMode openMode)
{
    Q_D(QIODevice);
#if defined QIODEVICE_DEBUG
    printf("%p QIODevice::setOpenMode(0x%x)\n", this, openMode.toInt());
#endif
    d->openMode = openMode;
    d->accessMode = QIODevicePrivate::Unset;
    d->setReadChannelCount(isReadable() ? qMax(d->readChannelCount, 1) : 0);
    d->setWriteChannelCount(isWritable() ? qMax(d->writeChannelCount, 1) : 0);
}